

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManPrintDecs(FILE *pFile,If_DsdMan_t *p)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  word *pwVar4;
  int nVars;
  uint uVar5;
  Vec_Ptr_t *p_00;
  int iVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  int (*local_530) [18];
  int pDecMax [15];
  int pCountsSSizes [15];
  int pCountsAll [15];
  int pCounts [15] [18];
  
  pDecMax[0xc] = 0;
  pDecMax[0xd] = 0;
  pDecMax[0xe] = 0;
  pDecMax[8] = 0;
  pDecMax[9] = 0;
  pDecMax[10] = 0;
  pDecMax[0xb] = 0;
  pDecMax[4] = 0;
  pDecMax[5] = 0;
  pDecMax[6] = 0;
  pDecMax[7] = 0;
  pDecMax[0] = 0;
  pDecMax[1] = 0;
  pDecMax[2] = 0;
  pDecMax[3] = 0;
  pCountsAll[0xc] = 0;
  pCountsAll[0xd] = 0;
  pCountsAll[0xe] = 0;
  pCountsAll[8] = 0;
  pCountsAll[9] = 0;
  pCountsAll[10] = 0;
  pCountsAll[0xb] = 0;
  pCountsAll[4] = 0;
  pCountsAll[5] = 0;
  pCountsAll[6] = 0;
  pCountsAll[7] = 0;
  pCountsAll[0] = 0;
  pCountsAll[1] = 0;
  pCountsAll[2] = 0;
  pCountsAll[3] = 0;
  pCountsSSizes[0xc] = 0;
  pCountsSSizes[0xd] = 0;
  pCountsSSizes[0xe] = 0;
  pCountsSSizes[8] = 0;
  pCountsSSizes[9] = 0;
  pCountsSSizes[10] = 0;
  pCountsSSizes[0xb] = 0;
  pCountsSSizes[4] = 0;
  pCountsSSizes[5] = 0;
  pCountsSSizes[6] = 0;
  pCountsSSizes[7] = 0;
  pCountsSSizes[0] = 0;
  pCountsSSizes[1] = 0;
  pCountsSSizes[2] = 0;
  pCountsSSizes[3] = 0;
  local_530 = pCounts;
  memset(local_530,0,0x438);
  nVars = p->nVars;
  lVar8 = 3;
  while( true ) {
    if (nVars < lVar8) {
      fwrite(" N :  ",6,1,(FILE *)pFile);
      fwrite(" Total  ",8,1,(FILE *)pFile);
      for (uVar5 = 0; uVar5 != 0x11; uVar5 = uVar5 + 1) {
        fprintf((FILE *)pFile,"%6d",(ulong)uVar5);
      }
      fwrite("  ",2,1,(FILE *)pFile);
      fwrite("  More",6,1,(FILE *)pFile);
      fwrite("     Ave",8,1,(FILE *)pFile);
      fwrite("     Max",8,1,(FILE *)pFile);
      fputc(10,(FILE *)pFile);
      for (uVar7 = 0; (long)uVar7 <= (long)p->nVars; uVar7 = uVar7 + 1) {
        fprintf((FILE *)pFile,"%2d :  ",uVar7 & 0xffffffff);
        uVar5 = pCountsAll[uVar7];
        fprintf((FILE *)pFile,"%6d  ",(ulong)uVar5);
        if ((int)uVar5 < 2) {
          uVar5 = 1;
        }
        dVar9 = (double)(int)uVar5;
        for (lVar8 = 0; lVar8 != 0x11; lVar8 = lVar8 + 1) {
          fprintf((FILE *)pFile,"%6.1f",((double)(*local_530)[lVar8] * 100.0) / dVar9);
        }
        fwrite("  ",2,1,(FILE *)pFile);
        fprintf((FILE *)pFile,"%6.1f",((double)pCounts[uVar7][0x11] * 100.0) / dVar9);
        fwrite("  ",2,1,(FILE *)pFile);
        fprintf((FILE *)pFile,"%6.1f",(double)pCountsSSizes[uVar7] / dVar9);
        fwrite("  ",2,1,(FILE *)pFile);
        fprintf((FILE *)pFile,"%6d",(ulong)(uint)pDecMax[uVar7]);
        fputc(10,(FILE *)pFile);
        local_530 = local_530 + 1;
      }
      return;
    }
    p_00 = p->vTtDecs[lVar8];
    iVar1 = p->vTtMem[lVar8]->nEntries;
    if (iVar1 != p_00->nSize) break;
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(p_00,iVar6);
      pwVar4 = Vec_MemReadEntry(p->vTtMem[lVar8],iVar6);
      nVars = p->nVars;
      iVar2 = Abc_TtSupportSize(pwVar4,nVars);
      iVar1 = *(int *)((long)pvVar3 + 4);
      if (*(int *)((long)pvVar3 + 4) < pDecMax[iVar2]) {
        iVar1 = pDecMax[iVar2];
      }
      pDecMax[iVar2] = iVar1;
      p_00 = p->vTtDecs[lVar8];
      iVar1 = p_00->nSize;
    }
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(p_00,iVar6);
      pwVar4 = Vec_MemReadEntry(p->vTtMem[lVar8],iVar6);
      nVars = p->nVars;
      iVar2 = Abc_TtSupportSize(pwVar4,nVars);
      pCountsAll[iVar2] = pCountsAll[iVar2] + 1;
      iVar1 = *(int *)((long)pvVar3 + 4);
      pCountsSSizes[iVar2] = pCountsSSizes[iVar2] + iVar1;
      if (0x10 < iVar1) {
        iVar1 = 0x11;
      }
      pCounts[iVar2][iVar1] = pCounts[iVar2][iVar1] + 1;
      p_00 = p->vTtDecs[lVar8];
      iVar1 = p_00->nSize;
    }
    lVar8 = lVar8 + 1;
  }
  __assert_fail("Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x215,"void If_DsdManPrintDecs(FILE *, If_DsdMan_t *)");
}

Assistant:

void If_DsdManPrintDecs( FILE * pFile, If_DsdMan_t * p )
{
    Vec_Int_t * vDecs;
    int i, k, v, nSuppSize, nDecMax = 0;
    int pDecMax[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsAll[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsSSizes[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCounts[IF_MAX_FUNC_LUTSIZE][DSD_ARRAY_LIMIT+2] = {{0}};
    word * pTruth;
    for ( v = 3; v <= p->nVars; v++ )
    {
        assert( Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v]) );
        // find max number of decompositions
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pDecMax[nSuppSize] = Abc_MaxInt( pDecMax[nSuppSize], Vec_IntSize(vDecs) );
            nDecMax = Abc_MaxInt( nDecMax, Vec_IntSize(vDecs) );
        }
        // fill up
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pCountsAll[nSuppSize]++;
            pCountsSSizes[nSuppSize] += Vec_IntSize(vDecs);
            pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs))]++;
    //        pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs)?1+(Vec_IntSize(vDecs)/10):0)]++;
    /*
            if ( nSuppSize == 6 && Vec_IntSize(vDecs) == pDecMax[6] )
            {
                fprintf( pFile, "0x" );
                Abc_TtPrintHex( pTruth, nSuppSize );
                Dau_DecPrintSets( vDecs, nSuppSize );
            }
    */
        }
    }
    // print header
    fprintf( pFile, " N :  " );
    fprintf( pFile, " Total  " );
    for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
        fprintf( pFile, "%6d", k );
    fprintf( pFile, "  " );
    fprintf( pFile, "  More" );
    fprintf( pFile, "     Ave" );
    fprintf( pFile, "     Max" );
    fprintf( pFile, "\n" );
    // print rows
    for ( i = 0; i <= p->nVars; i++ )
    {
        fprintf( pFile, "%2d :  ", i );
        fprintf( pFile, "%6d  ", pCountsAll[i] );
        for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
//            fprintf( pFile, "%6d", pCounts[i][k] );
            fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
//        fprintf( pFile, "%6d", pCounts[i][k] );
        fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6.1f", 1.0*pCountsSSizes[i]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6d", pDecMax[i] );
        fprintf( pFile, "\n" );
    }
}